

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
VectorInstance::op_pushFront
          (VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  size_type sVar1;
  undefined8 *puVar2;
  string *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  string *in_RSI;
  string *in_RDI;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *unaff_retaddr;
  const_iterator in_stack_00000008;
  shared_ptr<Instance> instance;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_stack_ffffffffffffff68;
  allocator *paVar3;
  allocator local_51;
  shared_ptr<Instance> *local_50;
  shared_ptr<Instance> *local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  string *value;
  string *type;
  
  local_18 = in_RDX;
  value = in_RSI;
  type = in_RDI;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar1 != 1) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  this_00 = in_RSI + 0x58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  get_shared_instance((string *)type,value);
  local_38 = (shared_ptr<Instance> *)
             std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
             begin(in_stack_ffffffffffffff68);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<Instance>const*,std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>>
  ::__normal_iterator<std::shared_ptr<Instance>*>
            ((__normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
              *)this_00,
             (__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
              *)in_stack_ffffffffffffff68);
  local_50 = (shared_ptr<Instance> *)
             std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
             insert(unaff_retaddr,in_stack_00000008,(value_type *)type);
  paVar3 = &local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"null",paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1c055e);
  return in_RDI;
}

Assistant:

std::string VectorInstance::op_pushFront(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    _value.insert(_value.begin(), instance);
    return "null";
}